

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerQueue.cpp
# Opt level: O0

int sznet::event_greater(Timer *lhs,Timer *rhs)

{
  int64_t iVar1;
  Timestamp local_40 [2];
  int64_t key2;
  int64_t local_28;
  int64_t key1;
  Timer *rhs_local;
  Timer *lhs_local;
  
  key1 = (int64_t)rhs;
  rhs_local = lhs;
  key2 = (int64_t)Timer::expiration(lhs);
  local_28 = Timestamp::microSecondsSinceEpoch((Timestamp *)&key2);
  local_40[0] = Timer::expiration(key1);
  iVar1 = Timestamp::microSecondsSinceEpoch(local_40);
  if (local_28 < iVar1) {
    lhs_local._4_4_ = -1;
  }
  else if (local_28 == iVar1) {
    lhs_local._4_4_ = 0;
  }
  else {
    lhs_local._4_4_ = 1;
  }
  return lhs_local._4_4_;
}

Assistant:

int event_greater(Timer* lhs, Timer* rhs)
{
	auto key1 = lhs->expiration().microSecondsSinceEpoch();
	auto key2 = rhs->expiration().microSecondsSinceEpoch();
	if (key1 < key2)
	{
		return -1;
	}
	else if (key1 == key2)
	{
		return 0;
	}
	else
	{
		return 1;
	}
}